

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maropuparser.h
# Opt level: O1

int __thiscall
FastPForLib::MaropuGapReader::open(MaropuGapReader *this,char *__file,int __oflag,...)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  char *pcVar3;
  ostream *poVar4;
  runtime_error *this_00;
  
  if ((FILE *)this->fd != (FILE *)0x0) {
    fclose((FILE *)this->fd);
    this->fd = (FILE *)0x0;
  }
  __stream = fopen((this->mFilename)._M_dataplus._M_p,"rb");
  this->fd = (FILE *)__stream;
  if (__stream != (FILE *)0x0) {
    iVar1 = setvbuf(__stream,(char *)0x0,0,0x1000);
    return iVar1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"IO status: ",0xb);
  piVar2 = __errno_location();
  pcVar3 = strerror(*piVar2);
  poVar4 = std::operator<<((ostream *)&std::cerr,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Can\'t open ",0xb);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(this->mFilename)._M_dataplus._M_p,
                      (this->mFilename)._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar4);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"could not open temp file");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void open() {
    close();
    fd = ::fopen(mFilename.c_str(), "rb");
    if (fd == NULL) {
      std::cerr << "IO status: " << strerror(errno) << std::endl;
      std::cerr << "Can't open " << mFilename << std::endl;
      throw std::runtime_error("could not open temp file");
    }
    setvbuf(fd, NULL, _IOFBF, 1024 * 4); // large buffer
  }